

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O2

void sample_output<trng::lagfib4plus<unsigned_long,3860u,7083u,11580u,19937u>>
               (lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *r,string *name)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  
  while (name->_M_string_length < 0x20) {
    std::__cxx11::string::push_back((char)name);
  }
  std::operator<<((ostream *)&std::cout,(string *)name);
  iVar2 = 0xf;
  while( true ) {
    trng::lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U>::operator()(r);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) break;
    std::operator<<(poVar1,'\t');
  }
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}